

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int64_t av1_rd_pick_intra_sby_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,int64_t best_rd,PICK_MODE_CONTEXT *ctx)

{
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *left_mi;
  WinnerModeStats *pWVar1;
  SPEED_FEATURES *pSVar2;
  int64_t iVar3;
  PICK_MODE_CONTEXT *pPVar4;
  MACROBLOCK *x_00;
  byte bVar5;
  byte bVar6;
  TX_SIZE tx_size;
  int i;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int64_t (*paiVar11) [9];
  int64_t iVar12;
  uint uVar13;
  RD_STATS *pRVar14;
  RD_STATS *this_rd;
  RD_STATS *pRVar15;
  uint *width;
  long lVar16;
  ulong uVar17;
  uint *rate_tokenonly_00;
  int mode_idx;
  int iVar18;
  RD_STATS *rd_cost;
  AV1_COMP *pAVar19;
  PALETTE_BUFFER *pPVar20;
  MACROBLOCK *x_01;
  int mode_idx_1;
  ulong uVar21;
  double dVar22;
  THR_MODES in_stack_fffffffffffff658;
  undefined7 in_stack_fffffffffffff659;
  undefined7 in_stack_fffffffffffff660;
  undefined1 in_stack_fffffffffffff667;
  uint8_t uVar23;
  AV1_COMP *pAVar24;
  BLOCK_SIZE BVar25;
  AV1_COMMON *cm;
  uint8_t *__dest;
  int in_stack_fffffffffffff680;
  int beat_best_rd;
  PALETTE_BUFFER *local_978;
  uint *local_970;
  INTRA_MODE_SPEED_FEATURES *local_968;
  uint *local_960;
  MACROBLOCK *local_958;
  uint local_950;
  int local_94c;
  int64_t local_948;
  int *local_940;
  uint8_t *local_938;
  ulong *local_930;
  uint local_924;
  double local_920;
  double local_918;
  ulong local_910;
  uint8_t *local_908;
  ulong local_900;
  int64_t local_8f8;
  uint8_t directional_mode_skip_mask [13];
  int block_height;
  ulong local_8c8;
  uint8_t local_8b0;
  int64_t top_intra_model_rd [4];
  MB_MODE_INFO best_mbmi;
  RD_STATS this_rd_stats;
  int64_t aiStack_7b0 [123];
  int64_t intra_modes_rd_cost [13] [9];
  
  mbmi = *(x->e_mbd).mi;
  directional_mode_skip_mask[8] = '\0';
  directional_mode_skip_mask[9] = '\0';
  directional_mode_skip_mask[10] = '\0';
  directional_mode_skip_mask[0xb] = '\0';
  directional_mode_skip_mask[0xc] = '\0';
  directional_mode_skip_mask[0] = '\0';
  directional_mode_skip_mask[1] = '\0';
  directional_mode_skip_mask[2] = '\0';
  directional_mode_skip_mask[3] = '\0';
  directional_mode_skip_mask[4] = '\0';
  directional_mode_skip_mask[5] = '\0';
  directional_mode_skip_mask[6] = '\0';
  directional_mode_skip_mask[7] = '\0';
  beat_best_rd = 0;
  local_8f8 = 0x7fffffffffffffff;
  local_970 = (uint *)rate_tokenonly;
  local_940 = rate;
  local_938 = skippable;
  local_930 = (ulong *)distortion;
  if (((cpi->oxcf).tool_cfg.enable_palette == true) &&
     (iVar7 = av1_allow_palette((uint)(cpi->common).features.allow_screen_content_tools,mbmi->bsize)
     , iVar7 != 0)) {
    local_978 = x->palette_buffer;
    local_948 = CONCAT71((int7)((ulong)local_978 >> 8),1);
  }
  else {
    local_948 = 0;
    local_978 = (PALETTE_BUFFER *)0x0;
  }
  left_mi = (x->e_mbd).left_mbmi;
  bVar5 = av1_above_block_mode((x->e_mbd).above_mbmi);
  bVar6 = av1_left_block_mode(left_mi);
  iVar7 = intra_mode_context[bVar5];
  iVar18 = intra_mode_context[bVar6];
  mbmi->angle_delta[0] = '\0';
  lVar10 = (long)(cpi->sf).intra_sf.intra_pruning_with_hog;
  this_rd = (RD_STATS *)(ulong)bsize;
  if (lVar10 != 0) {
    prune_intra_mode_with_hog
              (x,bsize,((cpi->common).seq_params)->sb_size,*(float *)(&DAT_00468d3c + lVar10 * 4),
               directional_mode_skip_mask,0);
  }
  local_960 = (uint *)((long)x->plane + (long)iVar7 * 0x2a4);
  lVar10 = (long)iVar18 * 0x34;
  uVar17 = 0;
  (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
  (mbmi->palette_mode_info).palette_size[0] = '\0';
  set_mode_eval_params(cpi,x,'\x01');
  memcpy(&best_mbmi,mbmi,0xb0);
  pWVar1 = x->winner_mode_stats;
  local_958 = x;
  if (pWVar1 != (WinnerModeStats *)0x0) {
    iVar12 = this_rd[0x1c395].sse;
    iVar3 = this_rd[0x1c396].rdcost;
    uVar21 = (ulong)(uint)winner_mode_count_allowed[(cpi->sf).winner_mode_sf.multi_winner_mode_type]
    ;
    if (winner_mode_count_allowed[(cpi->sf).winner_mode_sf.multi_winner_mode_type] < 1) {
      uVar21 = uVar17;
    }
    for (; uVar21 * 0x40f0 - uVar17 != 0; uVar17 = uVar17 + 0x40f0) {
      memset((void *)((long)(pWVar1->mbmi).mv + (uVar17 - 8)),0,0xe8);
      memset(pWVar1->color_index_map + uVar17,0,(ulong)(byte)iVar3 * (ulong)(byte)iVar12);
      (&pWVar1->mode_index)[uVar17] = '\0';
    }
  }
  x_01 = local_958;
  iVar7 = (int)local_958;
  local_960 = (uint *)(lVar10 + 0x4620 + (long)local_960);
  local_968 = &(cpi->sf).intra_sf;
  local_958->winner_mode_count = 0;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    top_intra_model_rd[lVar10] = 0x7fffffffffffffff;
  }
  paiVar11 = intra_modes_rd_cost;
  for (lVar10 = 0; lVar10 != 0xd; lVar10 = lVar10 + 1) {
    for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
      (*paiVar11)[lVar16] = 0x7fffffffffffffff;
    }
    paiVar11 = paiVar11 + 1;
  }
  local_900 = (ulong)((uint)this_rd & 0xfffffffc);
  cm = &cpi->common;
  local_908 = (local_958->txfm_search_info).blk_skip;
  iVar18 = 0;
  pRVar14 = (RD_STATS *)0xd;
  pAVar19 = cpi;
  do {
    rate_tokenonly_00 = local_970;
    uVar13 = (uint)pRVar14;
    if (iVar18 == 0x3d) {
      pRVar14 = this_rd;
      if ((char)local_948 != '\0') {
        uVar13 = *local_960;
        av1_rd_pick_palette_intra_sby
                  (cpi,x_01,(BLOCK_SIZE)this_rd,uVar13,&best_mbmi,local_978->best_palette_color_map,
                   &best_rd,local_940,(int *)local_970,(int64_t *)local_930,local_938,&beat_best_rd,
                   ctx,ctx->blk_skip,ctx->tx_type_map);
      }
      iVar12 = 0x7fffffffffffffff;
      if (beat_best_rd != 0) {
        iVar18 = av1_filter_intra_allowed_bsize(cm,(BLOCK_SIZE)this_rd);
        pAVar24 = pAVar19;
        if (iVar18 != 0) {
          if ((pAVar19->sf).intra_sf.prune_filter_intra_level != 2) {
            local_950 = *local_960;
            local_910 = (ulong)best_mbmi.mode;
            pPVar20 = (PALETTE_BUFFER *)*(x_01->e_mbd).mi;
            pPVar20->best_palette_color_map[0x5b] = '\x01';
            uVar13 = 0;
            pPVar20->best_palette_color_map[2] = '\0';
            pPVar20->best_palette_color_map[0x8e] = '\0';
            if ((x_01->use_mb_mode_cache == 0) ||
               ((x_01->mb_mode_cache->filter_intra_mode_info).use_filter_intra != '\0')) {
              uVar23 = '\x01';
              local_948 = local_8f8;
              local_924 = 0;
              local_920 = (double)((ulong)local_920 & 0xffffffff00000000);
              local_978 = pPVar20;
              for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
                pPVar20->best_palette_color_map[0x5a] = (uint8_t)uVar13;
                if ((((pAVar19->sf).intra_sf.prune_filter_intra_level != 1) ||
                    (("\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11"[local_910] >>
                      (uVar13 & 0x1f) & 1) != 0)) &&
                   ((x_01->use_mb_mode_cache == 0 ||
                    (uVar13 == (x_01->mb_mode_cache->filter_intra_mode_info).filter_intra_mode)))) {
                  local_968 = (INTRA_MODE_SPEED_FEATURES *)CONCAT44(local_968._4_4_,uVar13);
                  tx_size = '\x03';
                  if ((int)local_900 != 0xc) {
                    tx_size = (TX_SIZE)this_rd[0x1c397].dist;
                  }
                  BVar25 = (BLOCK_SIZE)this_rd;
                  pRVar15 = (RD_STATS *)0x1;
                  pAVar19 = pAVar24;
                  iVar12 = intra_model_rd(cm,x_01,0,BVar25,tx_size,1);
                  pAVar24 = pAVar19;
                  if ((local_948 == 0x7fffffffffffffff) ||
                     (rate_tokenonly_00 = local_970, iVar12 <= (local_948 >> 2) + local_948)) {
                    if (iVar12 < local_948) {
                      local_948 = iVar12;
                    }
                    av1_pick_uniform_tx_size_type_yrd
                              (pAVar19,x_01,(RD_STATS *)&block_height,BVar25,best_rd);
                    iVar18 = block_height;
                    rate_tokenonly_00 = local_970;
                    pPVar20 = local_978;
                    if (block_height != 0x7fffffff) {
                      local_94c = intra_mode_info_cost_y
                                            (pAVar19,x_01,(MB_MODE_INFO *)local_978,BVar25,local_950
                                             ,(int)pRVar15);
                      x_00 = local_958;
                      local_94c = local_94c + iVar18;
                      rd_cost = (RD_STATS *)
                                (local_8c8 * 0x80 +
                                ((long)x_01->rdmult * (long)local_94c + 0x100 >> 9));
                      this_rd = pRVar14;
                      if (((pAVar19->oxcf).mode == '\x02') &&
                         (rd_cost != (RD_STATS *)0x7fffffffffffffff)) {
                        local_918 = (double)(long)rd_cost;
                        dVar22 = intra_rd_variance_factor(pAVar19,local_958,(BLOCK_SIZE)pRVar14);
                        pAVar19 = pAVar24;
                        rd_cost = (RD_STATS *)(long)(dVar22 * local_918);
                        pAVar24 = pAVar19;
                        this_rd = pRVar14;
                      }
                      rate_tokenonly_00 = local_970;
                      pPVar20 = local_978;
                      pSVar2 = &pAVar19->sf;
                      pAVar19 = pAVar24;
                      store_winner_mode_stats
                                (cm,x_00,(MB_MODE_INFO *)local_978,rd_cost,
                                 (RD_STATS *)(ulong)(pSVar2->winner_mode_sf).multi_winner_mode_type,
                                 pRVar15,in_stack_fffffffffffff658,
                                 (uint8_t *)CONCAT17(uVar23,in_stack_fffffffffffff660),
                                 (BLOCK_SIZE)pAVar24,(int64_t)this_rd,(int)cm,
                                 in_stack_fffffffffffff680);
                      pPVar4 = ctx;
                      x_01 = x_00;
                      pAVar24 = pAVar19;
                      pRVar14 = this_rd;
                      if ((long)rd_cost < best_rd) {
                        uVar23 = pPVar20->best_palette_color_map[0x91];
                        local_924 = (uint)*(ushort *)(pPVar20->best_palette_color_map + 0x5a);
                        iVar18 = ctx->num_4x4_blk;
                        best_rd = (int64_t)rd_cost;
                        memcpy(&this_rd_stats,(x_00->e_mbd).tx_type_map,(long)iVar18);
                        x_01 = local_958;
                        memcpy(pPVar4->blk_skip,local_908,(long)iVar18);
                        *local_940 = local_94c;
                        *rate_tokenonly_00 = block_height;
                        *local_930 = local_8c8;
                        *local_938 = local_8b0;
                        local_920 = (double)CONCAT44(local_920._4_4_,1);
                        pAVar24 = pAVar19;
                        pRVar14 = this_rd;
                      }
                    }
                  }
                  uVar13 = (uint)local_968;
                }
              }
              if (local_920._0_4_ != 0) {
                pPVar20->best_palette_color_map[2] = '\0';
                pPVar20->best_palette_color_map[0x91] = uVar23;
                *(short *)(pPVar20->best_palette_color_map + 0x5a) = (short)local_924;
                memcpy(ctx->tx_type_map,&this_rd_stats,(long)ctx->num_4x4_blk);
                pAVar19 = pAVar24;
                memcpy(&best_mbmi,mbmi,0xb0);
                pAVar24 = pAVar19;
              }
            }
          }
          if (beat_best_rd == 0) {
            return 0x7fffffffffffffff;
          }
        }
        BVar25 = (BLOCK_SIZE)pRVar14;
        if ((pAVar19->sf).winner_mode_sf.multi_winner_mode_type == '\0') {
          iVar7 = is_winner_mode_processing_enabled(pAVar19,x_01,mbmi,uVar13);
          if (iVar7 != 0) {
            set_mode_eval_params(pAVar19,x_01,'\x02');
            memcpy(mbmi,&best_mbmi,0xb0);
            intra_block_yrd(pAVar19,x_01,BVar25,(int *)local_960,&best_rd,local_940,
                            (int *)rate_tokenonly_00,(int64_t *)local_930,local_938,&best_mbmi,ctx);
          }
        }
        else {
          __dest = (x_01->e_mbd).plane[0].color_index_map;
          lVar10 = 0;
          width = (uint *)&block_height;
          av1_get_block_dimensions
                    ((BLOCK_SIZE)this_rd,iVar7 + 0x1a0,(MACROBLOCKD *)&this_rd_stats,(int *)width,
                     (int *)0x0,(int *)0x0,
                     (int *)CONCAT71(in_stack_fffffffffffff659,in_stack_fffffffffffff658));
          uVar17 = 0;
          for (uVar21 = 0; (long)uVar21 < (long)x_01->winner_mode_count; uVar21 = uVar21 + 1) {
            memcpy(mbmi,(void *)((long)(x_01->winner_mode_stats->mbmi).mv + lVar10 + -8),0xb0);
            iVar7 = is_winner_mode_processing_enabled(pAVar24,x_01,mbmi,(int)width);
            if (iVar7 != 0) {
              pAVar19 = pAVar24;
              if ((mbmi->palette_mode_info).palette_size[0] != '\0') {
                memcpy(__dest,x_01->winner_mode_stats->color_index_map + lVar10,
                       (long)block_height * (long)this_rd_stats.rate);
                pAVar19 = pAVar24;
              }
              pAVar24 = pAVar19;
              set_mode_eval_params(pAVar19,local_958,'\x02');
              x_01 = local_958;
              width = local_960;
              iVar7 = intra_block_yrd(pAVar19,local_958,(BLOCK_SIZE)pRVar14,(int *)local_960,
                                      &best_rd,local_940,(int *)rate_tokenonly_00,
                                      (int64_t *)local_930,local_938,&best_mbmi,ctx);
              if (iVar7 != 0) {
                uVar17 = uVar21 & 0xffffffff;
              }
            }
            lVar10 = lVar10 + 0x40f0;
          }
          if (best_mbmi.palette_mode_info.palette_size[0] != '\0') {
            memcpy(__dest,x_01->winner_mode_stats[(int)uVar17].color_index_map,
                   (long)block_height * (long)this_rd_stats.rate);
          }
        }
        memcpy(mbmi,&best_mbmi,0xb0);
        memcpy((x_01->e_mbd).tx_type_map,ctx->tx_type_map,(long)ctx->num_4x4_blk);
        iVar12 = best_rd;
      }
      return iVar12;
    }
    set_y_mode_and_delta_angle(iVar18,mbmi,(cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra);
    uVar17 = (ulong)mbmi->angle_delta[0];
    bVar5 = mbmi->mode;
    bVar6 = bVar5 - 9;
    if (bVar6 < 0xfa) {
      pRVar14 = (RD_STATS *)CONCAT71((int7)((ulong)pRVar14 >> 8),1);
      if (0xf7 < bVar6) {
LAB_00222116:
        if ((cpi->oxcf).intra_mode_cfg.enable_directional_intra != true) goto LAB_002224c7;
        pRVar14 = (RD_STATS *)0x0;
      }
      uVar13 = (uint)bVar5;
      if ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra == true) {
        iVar8 = (cpi->sf).intra_sf.disable_smooth_intra;
        if ((bVar5 & 0xfe) != 10 || iVar8 == 0) {
LAB_00222165:
          if (((((((iVar8 == 0) || (uVar13 != 9)) ||
                 ((cpi->sf).intra_sf.prune_filter_intra_level != 0)) &&
                ((uVar13 != 0xc || ((cpi->oxcf).intra_mode_cfg.enable_paeth_intra != false)))) &&
               ((x_01->use_mb_mode_cache == 0 || (bVar5 == x_01->mb_mode_cache->mode)))) &&
              (((char)pRVar14 != '\0' ||
               ((directional_mode_skip_mask[bVar5] == '\0' &&
                (((BLOCK_8X4 < bsize && ((cpi->oxcf).intra_mode_cfg.enable_angle_delta != false)) ||
                 (mbmi->angle_delta[0] == '\0')))))))) &&
             ((bVar6 = (byte)this_rd[0x1c397].dist,
              ((uint)local_968->intra_y_mode_mask[bVar6] >> (uVar13 & 0x1f) & 1) != 0 &&
              (((((char)pRVar14 != '\0' ||
                  (cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra == 0 ||
                 (best_rd == 0x7fffffffffffffff || (uVar17 & 1) == 0)) ||
                (lVar10 = (best_rd >> 3) + best_rd, intra_modes_rd_cost[bVar5][uVar17 + 3] <= lVar10
                )) || (pRVar14 = (RD_STATS *)best_rd,
                      intra_modes_rd_cost[bVar5][uVar17 + 5] <= lVar10)))))) {
            if ((int)local_900 == 0xc) {
              bVar6 = 3;
            }
            iVar12 = intra_model_rd(cm,x_01,0,(BLOCK_SIZE)this_rd,bVar6,1);
            iVar8 = get_model_rd_index_for_pruning(x_01,local_968);
            uVar13 = (pAVar19->sf).intra_sf.top_intra_model_count_allowed;
            pRVar14 = (RD_STATS *)(ulong)uVar13;
            cpi = pAVar19;
            iVar8 = prune_intra_y_mode(iVar12,&local_8f8,top_intra_model_rd,uVar13,iVar8);
            pAVar19 = cpi;
            if ((iVar8 == 0) &&
               (pRVar15 = this_rd,
               av1_pick_uniform_tx_size_type_yrd
                         (cpi,x_01,&this_rd_stats,(BLOCK_SIZE)this_rd,best_rd),
               iVar8 = this_rd_stats.rate, pRVar14 = this_rd, pAVar19 = cpi, this_rd = pRVar15,
               this_rd_stats.rate != 0x7fffffff)) {
              local_910 = this_rd_stats.dist;
              local_94c = CONCAT31(local_94c._1_3_,this_rd_stats.skip_txfm);
              uVar13 = this_rd_stats.rate;
              if (((x_01->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) &&
                 (mbmi->bsize != BLOCK_4X4)) {
                iVar9 = tx_size_cost(x_01,(BLOCK_SIZE)pRVar15,mbmi->tx_size);
                uVar13 = iVar8 - iVar9;
                pAVar19 = cpi;
                this_rd = pRVar15;
              }
              cpi = pAVar19;
              local_950 = uVar13;
              iVar9 = intra_mode_info_cost_y
                                (pAVar19,x_01,mbmi,(BLOCK_SIZE)this_rd,local_960[mbmi->mode],
                                 (int)pAVar19);
              uVar21 = local_910;
              iVar9 = iVar9 + iVar8;
              local_918 = (double)CONCAT44(local_918._4_4_,iVar9);
              pRVar15 = (RD_STATS *)
                        (local_910 * 0x80 + ((long)x_01->rdmult * (long)iVar9 + 0x100 >> 9));
              if (((cpi->oxcf).mode == '\x02') && (pRVar15 != (RD_STATS *)0x7fffffffffffffff)) {
                local_920 = (double)(long)pRVar15;
                dVar22 = intra_rd_variance_factor(cpi,x_01,(BLOCK_SIZE)this_rd);
                pRVar15 = (RD_STATS *)(long)(dVar22 * local_920);
              }
              intra_modes_rd_cost[mbmi->mode][uVar17 + 4] = (int64_t)pRVar15;
              pRVar14 = pRVar15;
              store_winner_mode_stats
                        (cm,x_01,mbmi,pRVar15,
                         (RD_STATS *)(ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type,
                         (RD_STATS *)pAVar19,in_stack_fffffffffffff658,
                         (uint8_t *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
                         (BLOCK_SIZE)cpi,(int64_t)this_rd,(int)cm,in_stack_fffffffffffff680);
              pAVar19 = cpi;
              if ((long)pRVar15 < best_rd) {
                memcpy(&best_mbmi,mbmi,0xb0);
                pPVar4 = ctx;
                beat_best_rd = 1;
                *local_940 = local_918._0_4_;
                *local_970 = local_950;
                *local_930 = uVar21;
                pRVar14 = (RD_STATS *)(ulong)CONCAT31((int3)(local_950 >> 8),(uint8_t)local_94c);
                *local_938 = (uint8_t)local_94c;
                best_rd = (int64_t)pRVar15;
                memcpy(ctx->blk_skip,local_908,(long)ctx->num_4x4_blk);
                memcpy(pPVar4->tx_type_map,(x_01->e_mbd).tx_type_map,(long)pPVar4->num_4x4_blk);
                pAVar19 = cpi;
              }
            }
          }
        }
      }
      else if (2 < bVar6) {
        iVar8 = (cpi->sf).intra_sf.disable_smooth_intra;
        goto LAB_00222165;
      }
    }
    else if ((cpi->oxcf).intra_mode_cfg.enable_diagonal_intra != false) goto LAB_00222116;
LAB_002224c7:
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

int64_t av1_rd_pick_intra_sby_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                   int *rate, int *rate_tokenonly,
                                   int64_t *distortion, uint8_t *skippable,
                                   BLOCK_SIZE bsize, int64_t best_rd,
                                   PICK_MODE_CONTEXT *ctx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int64_t best_model_rd = INT64_MAX;
  int is_directional_mode;
  uint8_t directional_mode_skip_mask[INTRA_MODES] = { 0 };
  // Flag to check rd of any intra mode is better than best_rd passed to this
  // function
  int beat_best_rd = 0;
  const int *bmode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  uint8_t *best_palette_color_map =
      try_palette ? x->palette_buffer->best_palette_color_map : NULL;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];

  mbmi->angle_delta[PLANE_TYPE_Y] = 0;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  if (intra_sf->intra_pruning_with_hog) {
    // Less aggressive thresholds are used here than those used in inter frame
    // encoding in av1_handle_intra_y_mode() because we want key frames/intra
    // frames to have higher quality.
    const float thresh[4] = { -1.2f, -1.2f, -0.6f, 0.4f };
    const int is_chroma = 0;
    prune_intra_mode_with_hog(x, bsize, cpi->common.seq_params->sb_size,
                              thresh[intra_sf->intra_pruning_with_hog - 1],
                              directional_mode_skip_mask, is_chroma);
  }
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  pmi->palette_size[0] = 0;

  // Set params for mode evaluation
  set_mode_eval_params(cpi, x, MODE_EVAL);

  MB_MODE_INFO best_mbmi = *mbmi;
  const int max_winner_mode_count =
      winner_mode_count_allowed[cpi->sf.winner_mode_sf.multi_winner_mode_type];
  zero_winner_mode_stats(bsize, max_winner_mode_count, x->winner_mode_stats);
  x->winner_mode_count = 0;

  // Searches the intra-modes except for intrabc, palette, and filter_intra.
  int64_t top_intra_model_rd[TOP_INTRA_MODEL_COUNT];
  for (int i = 0; i < TOP_INTRA_MODEL_COUNT; i++) {
    top_intra_model_rd[i] = INT64_MAX;
  }

  // Initialize the rdcost corresponding to all the directional and
  // non-directional intra modes.
  // 1. For directional modes, it stores the rdcost values for delta angles -4,
  // -3, ..., 3, 4.
  // 2. The rdcost value for luma_delta_angle is stored at index
  // luma_delta_angle + MAX_ANGLE_DELTA + 1.
  // 3. The rdcost values for fictitious/nonexistent luma_delta_angle -4 and 4
  // (array indices 0 and 8) are always set to INT64_MAX (the initial value).
  int64_t intra_modes_rd_cost[INTRA_MODE_END]
                             [SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY];
  for (int i = 0; i < INTRA_MODE_END; i++) {
    for (int j = 0; j < SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY; j++) {
      intra_modes_rd_cost[i][j] = INT64_MAX;
    }
  }

  for (int mode_idx = INTRA_MODE_START; mode_idx < LUMA_MODE_COUNT;
       ++mode_idx) {
    set_y_mode_and_delta_angle(mode_idx, mbmi,
                               intra_sf->prune_luma_odd_delta_angles_in_intra);
    RD_STATS this_rd_stats;
    int this_rate, this_rate_tokenonly, s;
    int is_diagonal_mode;
    int64_t this_distortion, this_rd;
    const int luma_delta_angle = mbmi->angle_delta[PLANE_TYPE_Y];

    is_diagonal_mode = av1_is_diagonal_mode(mbmi->mode);
    if (is_diagonal_mode && !intra_mode_cfg->enable_diagonal_intra) continue;
    if (av1_is_directional_mode(mbmi->mode) &&
        !intra_mode_cfg->enable_directional_intra)
      continue;

    // The smooth prediction mode appears to be more frequently picked
    // than horizontal / vertical smooth prediction modes. Hence treat
    // them differently in speed features.
    if ((!intra_mode_cfg->enable_smooth_intra ||
         intra_sf->disable_smooth_intra) &&
        (mbmi->mode == SMOOTH_H_PRED || mbmi->mode == SMOOTH_V_PRED))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && mbmi->mode == SMOOTH_PRED)
      continue;

    // The functionality of filter intra modes and smooth prediction
    // overlap. Hence smooth prediction is pruned only if all the
    // filter intra modes are enabled.
    if (intra_sf->disable_smooth_intra &&
        intra_sf->prune_filter_intra_level == 0 && mbmi->mode == SMOOTH_PRED)
      continue;
    if (!intra_mode_cfg->enable_paeth_intra && mbmi->mode == PAETH_PRED)
      continue;

    // Skip the evaluation of modes that do not match with the winner mode in
    // x->mb_mode_cache.
    if (x->use_mb_mode_cache && mbmi->mode != x->mb_mode_cache->mode) continue;

    is_directional_mode = av1_is_directional_mode(mbmi->mode);
    if (is_directional_mode && directional_mode_skip_mask[mbmi->mode]) continue;
    if (is_directional_mode &&
        !(av1_use_angle_delta(bsize) && intra_mode_cfg->enable_angle_delta) &&
        luma_delta_angle != 0)
      continue;

    // Use intra_y_mode_mask speed feature to skip intra mode evaluation.
    if (!(intra_sf->intra_y_mode_mask[max_txsize_lookup[bsize]] &
          (1 << mbmi->mode)))
      continue;

    if (prune_luma_odd_delta_angles_using_rd_cost(
            mbmi, intra_modes_rd_cost[mbmi->mode], best_rd,
            intra_sf->prune_luma_odd_delta_angles_in_intra))
      continue;

    const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
    const int64_t this_model_rd =
        intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

    const int model_rd_index_for_pruning =
        get_model_rd_index_for_pruning(x, intra_sf);

    if (prune_intra_y_mode(this_model_rd, &best_model_rd, top_intra_model_rd,
                           intra_sf->top_intra_model_count_allowed,
                           model_rd_index_for_pruning))
      continue;

    // Builds the actual prediction. The prediction from
    // model_intra_yrd_and_prune was just an estimation that did not take into
    // account the effect of txfm pipeline, so we need to redo it for real
    // here.
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &this_rd_stats, bsize, best_rd);
    this_rate_tokenonly = this_rd_stats.rate;
    this_distortion = this_rd_stats.dist;
    s = this_rd_stats.skip_txfm;

    if (this_rate_tokenonly == INT_MAX) continue;

    if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
      // av1_pick_uniform_tx_size_type_yrd above includes the cost of the
      // tx_size in the tokenonly rate, but for intra blocks, tx_size is always
      // coded (prediction granularity), so we account for it in the full rate,
      // not the tokenonly rate.
      this_rate_tokenonly -= tx_size_cost(x, bsize, mbmi->tx_size);
    }
    this_rate =
        this_rd_stats.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, bmode_costs[mbmi->mode], 0);
    this_rd = RDCOST(x->rdmult, this_rate, this_distortion);

    // Visual quality adjustment based on recon vs source variance.
    if ((cpi->oxcf.mode == ALLINTRA) && (this_rd != INT64_MAX)) {
      this_rd = (int64_t)(this_rd * intra_rd_variance_factor(cpi, x, bsize));
    }

    intra_modes_rd_cost[mbmi->mode][luma_delta_angle + MAX_ANGLE_DELTA + 1] =
        this_rd;

    // Collect mode stats for multiwinner mode processing
    const int txfm_search_done = 1;
    store_winner_mode_stats(
        &cpi->common, x, mbmi, NULL, NULL, NULL, 0, NULL, bsize, this_rd,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      // Setting beat_best_rd flag because current mode rd is better than
      // best_rd passed to this function
      beat_best_rd = 1;
      *rate = this_rate;
      *rate_tokenonly = this_rate_tokenonly;
      *distortion = this_distortion;
      *skippable = s;
      memcpy(ctx->blk_skip, x->txfm_search_info.blk_skip,
             sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    }
  }

  // Searches palette
  if (try_palette) {
    av1_rd_pick_palette_intra_sby(
        cpi, x, bsize, bmode_costs[DC_PRED], &best_mbmi, best_palette_color_map,
        &best_rd, rate, rate_tokenonly, distortion, skippable, &beat_best_rd,
        ctx, ctx->blk_skip, ctx->tx_type_map);
  }

  // Searches filter_intra
  if (beat_best_rd && av1_filter_intra_allowed_bsize(&cpi->common, bsize)) {
    if (rd_pick_filter_intra_sby(cpi, x, rate, rate_tokenonly, distortion,
                                 skippable, bsize, bmode_costs[DC_PRED],
                                 best_mbmi.mode, &best_rd, &best_model_rd,
                                 ctx)) {
      best_mbmi = *mbmi;
    }
  }

  // No mode is identified with less rd value than best_rd passed to this
  // function. In such cases winner mode processing is not necessary and return
  // best_rd as INT64_MAX to indicate best mode is not identified
  if (!beat_best_rd) return INT64_MAX;

  // In multi-winner mode processing, perform tx search for few best modes
  // identified during mode evaluation. Winner mode processing uses best tx
  // configuration for tx search.
  if (cpi->sf.winner_mode_sf.multi_winner_mode_type) {
    int best_mode_idx = 0;
    int block_width, block_height;
    uint8_t *color_map_dst = xd->plane[PLANE_TYPE_Y].color_index_map;
    av1_get_block_dimensions(bsize, AOM_PLANE_Y, xd, &block_width,
                             &block_height, NULL, NULL);

    for (int mode_idx = 0; mode_idx < x->winner_mode_count; mode_idx++) {
      *mbmi = x->winner_mode_stats[mode_idx].mbmi;
      if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
        // Restore color_map of palette mode before winner mode processing
        if (mbmi->palette_mode_info.palette_size[0] > 0) {
          uint8_t *color_map_src =
              x->winner_mode_stats[mode_idx].color_index_map;
          memcpy(color_map_dst, color_map_src,
                 block_width * block_height * sizeof(*color_map_src));
        }
        // Set params for winner mode evaluation
        set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);

        // Winner mode processing
        // If previous searches use only the default tx type/no R-D optimization
        // of quantized coeffs, do an extra search for the best tx type/better
        // R-D optimization of quantized coeffs
        if (intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                            rate_tokenonly, distortion, skippable, &best_mbmi,
                            ctx))
          best_mode_idx = mode_idx;
      }
    }
    // Copy color_map of palette mode for final winner mode
    if (best_mbmi.palette_mode_info.palette_size[0] > 0) {
      uint8_t *color_map_src =
          x->winner_mode_stats[best_mode_idx].color_index_map;
      memcpy(color_map_dst, color_map_src,
             block_width * block_height * sizeof(*color_map_src));
    }
  } else {
    // If previous searches use only the default tx type/no R-D optimization of
    // quantized coeffs, do an extra search for the best tx type/better R-D
    // optimization of quantized coeffs
    if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
      // Set params for winner mode evaluation
      set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);
      *mbmi = best_mbmi;
      intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                      rate_tokenonly, distortion, skippable, &best_mbmi, ctx);
    }
  }
  *mbmi = best_mbmi;
  av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
  return best_rd;
}